

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int get_next_gm_job(AV1_COMP *cpi,int *frame_idx,int cur_dir)

{
  char cVar1;
  int8_t cur_frame_to_process;
  int total_refs;
  GlobalMotionJobInfo *job_info;
  GlobalMotionInfo *gm_info;
  int cur_dir_local;
  int *frame_idx_local;
  AV1_COMP *cpi_local;
  int local_4;
  
  cVar1 = (cpi->mt_info).gm_sync.job_info.next_frame_to_process[cur_dir];
  if (((int)cVar1 < (cpi->gm_info).num_ref_frames[cur_dir]) &&
     ((cpi->mt_info).gm_sync.job_info.early_exit[cur_dir] == '\0')) {
    *frame_idx = (int)(cpi->gm_info).reference_frames[cur_dir][cVar1].frame;
    (cpi->mt_info).gm_sync.job_info.next_frame_to_process[cur_dir] =
         (cpi->mt_info).gm_sync.job_info.next_frame_to_process[cur_dir] + '\x01';
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int get_next_gm_job(AV1_COMP *cpi, int *frame_idx, int cur_dir) {
  GlobalMotionInfo *gm_info = &cpi->gm_info;
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  int total_refs = gm_info->num_ref_frames[cur_dir];
  int8_t cur_frame_to_process = job_info->next_frame_to_process[cur_dir];

  if (cur_frame_to_process < total_refs && !job_info->early_exit[cur_dir]) {
    *frame_idx = gm_info->reference_frames[cur_dir][cur_frame_to_process].frame;
    job_info->next_frame_to_process[cur_dir] += 1;
    return 1;
  }
  return 0;
}